

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# producer.cc
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  Message *this;
  int i;
  uint uVar2;
  ulong uVar3;
  char message [10];
  char local_3a [10];
  
  iVar1 = open("shared.dat",0x242,0x1b6);
  if (iVar1 == -1) {
    puts("open returned (-1)");
    iVar1 = -1;
  }
  else {
    this = Message::CopyToMemoryMappedFile(iVar1);
    uVar3 = 0;
    do {
      sprintf(local_3a,"%d\n",uVar3);
      Message::EnqueueMessage(this,local_3a);
      printf("enqueued %d\n",uVar3);
      uVar2 = (int)uVar3 + 1;
      uVar3 = (ulong)uVar2;
    } while (uVar2 != 100);
    puts("message queue written");
    getchar();
    Message::ReleaseFile(this,iVar1);
    close(iVar1);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int main(int argc, char* argv[])
{

    const char *sharedFileName = "shared.dat";
    const mode_t mode = 0666;
    const int openFlags = (O_CREAT | O_TRUNC | O_RDWR);
    int fd = open(sharedFileName, openFlags, mode);

    if(fd == (-1))
    {
        printf("open returned (-1)\n");
        return (-1);
    }

    Message* msg = Message::CopyToMemoryMappedFile(fd);

    for(int i = 0; i < 100; i++)
    {
        char message[10];
        sprintf(message, "%d\n", i);
        msg->EnqueueMessage(&message[0]);
        printf("enqueued %d\n", i);
    }

    printf("message queue written\n");
    getchar();

    Message::ReleaseFile(msg, fd);

    close(fd);
}